

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void printcrbitm(MCInst *MI,uint OpNo,SStream *O)

{
  uint uVar1;
  MCOperand *op;
  uint CCReg;
  uint tmp;
  uint RegNo;
  SStream *O_local;
  uint OpNo_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNo);
  uVar1 = MCOperand_getReg(op);
  switch(uVar1) {
  default:
    CCReg._0_1_ = 0;
    break;
  case 0xc:
    CCReg._0_1_ = 1;
    break;
  case 0xd:
    CCReg._0_1_ = 2;
    break;
  case 0xe:
    CCReg._0_1_ = 3;
    break;
  case 0xf:
    CCReg._0_1_ = 4;
    break;
  case 0x10:
    CCReg._0_1_ = 5;
    break;
  case 0x11:
    CCReg._0_1_ = 6;
    break;
  case 0x12:
    CCReg._0_1_ = 7;
  }
  uVar1 = 0x80 >> (sbyte)CCReg;
  if (uVar1 < 10) {
    SStream_concat(O,"%u",(ulong)uVar1);
  }
  else {
    SStream_concat(O,"0x%x",(ulong)uVar1);
  }
  return;
}

Assistant:

static void printcrbitm(MCInst *MI, unsigned OpNo, SStream *O)
{
	unsigned RegNo, tmp;
	unsigned CCReg = MCOperand_getReg(MCInst_getOperand(MI, OpNo));

	switch (CCReg) {
		default: // llvm_unreachable("Unknown CR register");
		case PPC_CR0: RegNo = 0; break;
		case PPC_CR1: RegNo = 1; break;
		case PPC_CR2: RegNo = 2; break;
		case PPC_CR3: RegNo = 3; break;
		case PPC_CR4: RegNo = 4; break;
		case PPC_CR5: RegNo = 5; break;
		case PPC_CR6: RegNo = 6; break;
		case PPC_CR7: RegNo = 7; break;
	}

	tmp = 0x80 >> RegNo;
	if (tmp > HEX_THRESHOLD)
		SStream_concat(O, "0x%x", tmp);
	else
		SStream_concat(O, "%u", tmp);
}